

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Cord * __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::elements
          (RepeatedField<absl::lts_20240722::Cord> *this,bool is_soo)

{
  Cord *pCVar1;
  string *psVar2;
  int new_size;
  uint old_size;
  undefined7 in_register_00000031;
  LongSooRep *this_00;
  LongSooRep local_20;
  
  psVar2 = (string *)0x0;
  new_size = 0;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    new_size = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (new_size < 1) {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)new_size,0,"Capacity(is_soo) > 0");
  }
  if (psVar2 != (string *)0x0) {
    this_00 = &local_20;
    elements();
    UnpoisonBuffer((RepeatedField<absl::lts_20240722::Cord> *)this_00);
    GrowNoAnnotate((RepeatedField<absl::lts_20240722::Cord> *)this_00,SUB81(psVar2,0),old_size,
                   new_size);
    pCVar1 = (Cord *)0x0;
    if (((this_00->elements_int & 4) != 0) &&
       (pCVar1 = (Cord *)(ulong)(uint)this_00->capacity, this_00->capacity != old_size)) {
      pCVar1 = (Cord *)internal::LongSooRep::elements(this_00);
      return pCVar1;
    }
    return pCVar1;
  }
  if (!is_soo) {
    pCVar1 = (Cord *)internal::LongSooRep::elements((LongSooRep *)this);
    return pCVar1;
  }
  return (Cord *)((long)&(this->soo_rep_).field_0 + 8);
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }